

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBase.hpp
# Opt level: O0

void __thiscall
Diligent::QueryBase<Diligent::EngineVkImplTraits>::OnEndQuery
          (QueryBase<Diligent::EngineVkImplTraits> *this,DeviceContextImplType *pContext)

{
  DeviceContextVkImpl *pDVar1;
  Char *pCVar2;
  char (*in_R8) [37];
  undefined1 local_68 [8];
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  DeviceContextImplType *pContext_local;
  QueryBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = pContext;
  if ((this->
      super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>)
      .m_Desc.Type == QUERY_TYPE_TIMESTAMP) {
    pDVar1 = Diligent::RefCntAutoPtr::operator_cast_to_DeviceContextVkImpl_
                       ((RefCntAutoPtr *)&this->m_pContext);
    if ((pDVar1 != (DeviceContextVkImpl *)0x0) &&
       (pDVar1 = Diligent::RefCntAutoPtr::operator_cast_to_DeviceContextVkImpl_
                           ((RefCntAutoPtr *)&this->m_pContext),
       pDVar1 != (DeviceContextVkImpl *)msg.field_2._8_8_)) {
      (**(code **)((long)(this->
                         super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                         ).super_ObjectBase<Diligent::IQueryVk>.
                         super_RefCountedObject<Diligent::IQueryVk>.super_IQueryVk.super_IQuery.
                         super_IDeviceObject.super_IObject + 0x48))();
    }
    RefCntAutoPtr<Diligent::DeviceContextVkImpl>::operator=
              (&this->m_pContext,(DeviceContextVkImpl *)msg.field_2._8_8_);
  }
  else {
    if ((this->m_State != Querying) ||
       (pDVar1 = Diligent::RefCntAutoPtr::operator_cast_to_DeviceContextVkImpl_
                           ((RefCntAutoPtr *)&this->m_pContext),
       pDVar1 == (DeviceContextVkImpl *)0x0)) {
      FormatString<char[26],char_const*,char[27]>
                ((string *)local_38,(Diligent *)"Attempting to end query \'",
                 (char (*) [26])
                 &(this->
                  super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                  ).m_Desc,(char **)"\' that has not been begun.",(char (*) [27])in_R8);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"OnEndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0x95);
      std::__cxx11::string::~string((string *)local_38);
    }
    pDVar1 = Diligent::RefCntAutoPtr::operator_cast_to_DeviceContextVkImpl_
                       ((RefCntAutoPtr *)&this->m_pContext);
    if (pDVar1 != (DeviceContextVkImpl *)msg.field_2._8_8_) {
      FormatString<char[8],char_const*,char[37]>
                ((string *)local_68,(Diligent *)"Query \'",
                 (char (*) [8])
                 &(this->
                  super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                  ).m_Desc,(char **)"\' has been begun by another context.",in_R8);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"OnEndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0x96);
      std::__cxx11::string::~string((string *)local_68);
    }
  }
  this->m_State = Ended;
  return;
}

Assistant:

void OnEndQuery(DeviceContextImplType* pContext)
    {
        if (this->m_Desc.Type != QUERY_TYPE_TIMESTAMP)
        {
            DEV_CHECK_ERR(m_State == QueryState::Querying && m_pContext != nullptr,
                          "Attempting to end query '", this->m_Desc.Name, "' that has not been begun.");
            DEV_CHECK_ERR(m_pContext == pContext, "Query '", this->m_Desc.Name, "' has been begun by another context.");
        }
        else
        {
            // Timestamp queries are never begun
            if (m_pContext != nullptr && m_pContext != pContext)
                Invalidate();

            m_pContext = pContext;
        }

        m_State = QueryState::Ended;
    }